

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O2

void x11_send_eof(Channel *chan)

{
  ChannelVtable *pCVar1;
  long lStack_8;
  
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x26a,"void x11_send_eof(Channel *)");
  }
  pCVar1 = chan[-1].vt;
  if (pCVar1 == (ChannelVtable *)0x0) {
    pCVar1 = *(ChannelVtable **)&chan[-2].initial_fixed_window_size;
    if (pCVar1 == (ChannelVtable *)0x0) {
      return;
    }
    lStack_8 = 8;
  }
  else {
    lStack_8 = 0x20;
  }
  (**(code **)(pCVar1->free + lStack_8))();
  return;
}

Assistant:

static void x11_send_eof(Channel *chan)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);

    if (xconn->s) {
        sk_write_eof(xconn->s);
    } else {
        /*
         * If EOF is received from the X client before we've got to
         * the point of actually connecting to an X server, then we
         * should send an EOF back to the client so that the
         * forwarded channel will be terminated.
         */
        if (xconn->c)
            sshfwd_write_eof(xconn->c);
    }
}